

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zesDeviceGetOverclockDomains(zes_device_handle_t hDevice,uint32_t *pOverclockDomains)

{
  ze_result_t zVar1;
  
  if (DAT_0010ea58 != (code *)0x0) {
    zVar1 = (*DAT_0010ea58)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetOverclockDomains(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pOverclockDomains                     ///< [in,out] Returns the overclock domains that are supported (a bit for
                                                        ///< each of enum ::zes_overclock_domain_t). If no bits are set, the device
                                                        ///< doesn't support overclocking.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetOverclockDomains = context.zesDdiTable.Device.pfnGetOverclockDomains;
        if( nullptr != pfnGetOverclockDomains )
        {
            result = pfnGetOverclockDomains( hDevice, pOverclockDomains );
        }
        else
        {
            // generic implementation
        }

        return result;
    }